

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

ptrlen BinarySource_get_chars_internal(BinarySource *src,char *set,_Bool include)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  size_t sVar4;
  _Bool _Var5;
  char *pcVar6;
  ptrlen pVar7;
  
  pvVar1 = src->data;
  sVar2 = src->pos;
  while( true ) {
    _Var5 = BinarySource_data_avail(src,1);
    pvVar3 = src->data;
    sVar4 = src->pos;
    if (!_Var5) break;
    pcVar6 = strchr(set,(int)*(char *)((long)pvVar3 + sVar4));
    if ((pcVar6 == (char *)0x0) == include) break;
    src->pos = sVar4 + 1;
  }
  pVar7.ptr = (void *)((long)pvVar1 + sVar2);
  pVar7.len = (long)pvVar3 + (sVar4 - (long)pVar7.ptr);
  return pVar7;
}

Assistant:

static ptrlen BinarySource_get_chars_internal(
    BinarySource *src, const char *set, bool include)
{
    const char *start = here;
    while (avail(1)) {
        bool present = NULL != strchr(set, *(const char *)consume(0));
        if (present != include)
            break;
        (void) consume(1);
    }
    const char *end = here;
    return make_ptrlen(start, end - start);
}